

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::fboc::details::Context::Context
          (Context *this,TestContext *testCtx,RenderContext *renderCtx,CheckerFactory *factory)

{
  FormatExtEntries extRange_00;
  FormatExtEntries extRange;
  CheckerFactory *factory_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  Context *this_local;
  
  this->m_testCtx = testCtx;
  this->m_renderCtx = renderCtx;
  FboUtil::FormatDB::FormatDB(&this->m_coreFormats);
  FboUtil::FormatDB::FormatDB(&this->m_ctxFormats);
  FboUtil::FormatDB::FormatDB(&this->m_allFormats);
  FboUtil::FboVerifier::FboVerifier(&this->m_verifier,&this->m_ctxFormats,factory,renderCtx);
  this->m_haveMultiColorAtts = false;
  extRange_00.m_end =
       (FormatExtEntry *)
       &LongStressCaseInternal::DebugInfoRenderer::addTextToBuffer(std::__cxx11::string_const&,int)
        ::charsStr_abi_cxx11_;
  extRange_00.m_begin = (FormatExtEntry *)s_esExtFormats;
  addExtFormats(this,extRange_00);
  return;
}

Assistant:

Context::Context (TestContext& testCtx,
				  RenderContext& renderCtx,
				  CheckerFactory& factory)
	: m_testCtx				(testCtx)
	, m_renderCtx			(renderCtx)
	, m_verifier			(m_ctxFormats, factory, renderCtx)
	, m_haveMultiColorAtts	(false)
{
	FormatExtEntries extRange = GLS_ARRAY_RANGE(s_esExtFormats);
	addExtFormats(extRange);
}